

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

string * __thiscall
notch::core::TanhActivation::tag_abi_cxx11_(string *__return_storage_ptr__,TanhActivation *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string tag() const { return name; }